

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O1

ConsCell * find_close_cell(conspage *page,LispPTR oldcell)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  uVar2 = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  if (uVar2 == 0) {
    return (ConsCell *)0x0;
  }
  uVar4 = oldcell & 0xff;
  uVar3 = uVar2;
  if (uVar4 + 0xe < uVar2 || uVar2 <= uVar4) {
    do {
      uVar2 = *(uint *)((long)&page->cell6 + (ulong)uVar3 * 2);
      if (uVar2 < 0x1000000) {
        return (ConsCell *)0x0;
      }
      uVar2 = uVar2 >> 0x18;
      uVar1 = (ulong)uVar3;
      uVar3 = uVar2;
    } while (uVar4 + 0xe < uVar2 || uVar2 <= uVar4);
  }
  uVar3 = *(uint *)((long)&page->cell6 + (ulong)uVar2 * 2);
  if ((int)uVar1 == 0) {
    *(uint *)&page->field_0x8 = *(uint *)&page->field_0x8 & 0xff00ffff | uVar3 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&page->cell6 + uVar1 * 2 + 3) = (char)(uVar3 >> 0x18);
  }
  page->field_0xb = (char)((uint)(byte)page->field_0xb * 0x1000000 + -0x1000000 >> 0x18);
  return (ConsCell *)((long)&page->cell6 + (ulong)uVar2 * 2);
}

Assistant:

static ConsCell *find_close_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;

  while (offset) {
    if ((offset > oldoffset) && (offset <= (oldoffset + 14))) {
      if (prior)
        ((freecons *)((DLword *)page + prior))->next_free =
            ((freecons *)((DLword *)page + offset))->next_free;
      else
        page->next_cell = ((freecons *)((DLword *)page + offset))->next_free;
      page->count -= 1;
      return (ConsCell *)((DLword *)page + offset);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}